

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef *message)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestCase *pTVar3;
  pointer pcVar4;
  IStreamingReporter *pIVar5;
  AssertionResultData tempResult;
  SectionInfo testCaseSection;
  AssertionResult result;
  Counts assertions;
  SectionStats testCaseSectionStats;
  Totals deltaTotals;
  string local_3d8;
  string local_3b8;
  char *local_398;
  size_type local_390;
  void *local_388;
  AssertionResultData local_380;
  SectionInfo local_328;
  undefined1 local_2d8 [8];
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  int local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [13];
  AssertionResult local_1a8;
  Counts local_108;
  SectionStats local_e8;
  Totals local_68;
  
  local_398 = message->m_start;
  local_390 = message->m_size;
  local_388 = (void *)0x0;
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0x11])();
  if (local_388 != (void *)0x0) {
    operator_delete__(local_388);
  }
  local_380.message._M_dataplus._M_p = (pointer)&local_380.message.field_2;
  local_380.message._M_string_length = 0;
  local_380.message.field_2._M_local_buf[0] = '\0';
  local_380.reconstructedExpression._M_dataplus._M_p =
       (pointer)&local_380.reconstructedExpression.field_2;
  local_380.reconstructedExpression._M_string_length = 0;
  local_380.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_380.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_380.lazyExpression.m_isNegated = false;
  local_380.resultType = FatalErrorCondition;
  local_2d8 = (undefined1  [8])&local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,message->m_start,message->m_start + message->m_size);
  std::__cxx11::string::operator=((string *)&local_380,(string *)local_2d8);
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8);
  }
  AssertionResult::AssertionResult(&local_1a8,&this->m_lastAssertionInfo,&local_380);
  assertionEnded(this,&local_1a8);
  handleUnfinishedSections(this);
  pTVar3 = this->m_activeTestCase;
  local_328.name._M_dataplus._M_p = (pointer)&local_328.name.field_2;
  pcVar4 = (pTVar3->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,pcVar4,pcVar4 + (pTVar3->super_TestCaseInfo).name._M_string_length
            );
  paVar2 = &local_328.description.field_2;
  local_328.description._M_string_length = 0;
  local_328.description.field_2._M_local_buf[0] = '\0';
  local_328.lineInfo.file = (pTVar3->super_TestCaseInfo).lineInfo.file;
  local_328.lineInfo.line = (pTVar3->super_TestCaseInfo).lineInfo.line;
  local_108.passed = 0;
  local_108.failedButOk = 0;
  local_108.failed = 1;
  local_328.description._M_dataplus._M_p = (pointer)paVar2;
  SectionStats::SectionStats(&local_e8,&local_328,&local_108,0.0,false);
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar5->_vptr_IStreamingReporter[0xc])(pIVar5,&local_e8);
  local_68.error = 0;
  local_68.testCases.failedButOk = 0;
  local_68.assertions.passed = 0;
  local_68.assertions.failedButOk = 0;
  local_68.testCases.passed = 0;
  local_68.testCases.failed = 1;
  local_68.assertions.failed = 1;
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_local_buf[0] = '\0';
  local_3d8._M_string_length = 0;
  local_3d8.field_2._M_local_buf[0] = '\0';
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_2d8,&this->m_activeTestCase->super_TestCaseInfo,&local_68,
             &local_3b8,&local_3d8,false);
  (*pIVar5->_vptr_IStreamingReporter[0xd])(pIVar5,local_2d8);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_2d0._M_p = (pointer)0x0;
  local_2c8._M_local_buf[0] = '\0';
  local_2d8 = (undefined1  [8])&local_2c8;
  testGroupEnded(this,(string *)local_2d8,&this->m_totals,1,1);
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8);
  }
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_2d8 = (undefined1  [8])&PTR__TestRunStats_001935d0;
  pcVar4 = (this->m_runInfo).name._M_dataplus._M_p;
  local_2d0._M_p = local_2c8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar4,pcVar4 + (this->m_runInfo).name._M_string_length);
  local_280[0]._0_8_ = (this->m_totals).testCases.failedButOk;
  local_2b0 = (this->m_totals).error;
  uStack_2ac = *(undefined4 *)&(this->m_totals).field_0x4;
  uStack_2a8 = (undefined4)(this->m_totals).assertions.passed;
  uStack_2a4 = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  local_2a0._M_allocated_capacity._0_4_ = (undefined4)(this->m_totals).assertions.failed;
  local_2a0._M_allocated_capacity._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_2a0._8_4_ = (undefined4)(this->m_totals).assertions.failedButOk;
  local_2a0._12_4_ = *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_290 = (undefined4)(this->m_totals).testCases.passed;
  uStack_28c = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  uStack_288 = (undefined4)(this->m_totals).testCases.failed;
  uStack_284 = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_280[0]._M_local_buf[8] = '\0';
  (*pIVar5->_vptr_IStreamingReporter[0xf])(pIVar5);
  local_2d8 = (undefined1  [8])&PTR__TestRunStats_001935d0;
  if (local_2d0._M_p != local_2c8._M_local_buf + 8) {
    operator_delete(local_2d0._M_p);
  }
  SectionStats::~SectionStats(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.description._M_dataplus._M_p != paVar2) {
    operator_delete(local_328.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.name._M_dataplus._M_p != &local_328.name.field_2) {
    operator_delete(local_328.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_1a8.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_1a8.m_resultData.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_resultData.message._M_dataplus._M_p != &local_1a8.m_resultData.message.field_2)
  {
    operator_delete(local_1a8.m_resultData.message._M_dataplus._M_p);
  }
  if (local_1a8.m_info.capturedExpression.m_data != (char *)0x0) {
    operator_delete__(local_1a8.m_info.capturedExpression.m_data);
  }
  if (local_1a8.m_info.macroName.m_data != (char *)0x0) {
    operator_delete__(local_1a8.m_info.macroName.m_data);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.reconstructedExpression._M_dataplus._M_p !=
      &local_380.reconstructedExpression.field_2) {
    operator_delete(local_380.reconstructedExpression._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.message._M_dataplus._M_p != &local_380.message.field_2) {
    operator_delete(local_380.message._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = message;
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }